

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::NeuralNetwork::MergePartialFromCodedStream
          (NeuralNetwork *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  undefined8 in_RAX;
  NeuralNetworkLayer *value_00;
  NeuralNetworkPreprocessing *value_01;
  NetworkUpdateParameters *value_02;
  char cVar5;
  ulong uVar6;
  int value_1;
  int value;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_00195fda:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00195ffd;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00195ffd:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) goto switchD_0019605b_caseD_3;
    cVar5 = (char)uVar6;
    switch((uint)(uVar6 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar5 != '\n') break;
      value_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                           (&this->layers_);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkLayer>(input,value_00);
      goto LAB_0019603e;
    case 2:
      if (cVar5 == '\x12') {
        value_01 = google::protobuf::
                   RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Add
                             (&this->preprocessing_);
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkPreprocessing>
                          (input,value_01);
        goto LAB_0019603e;
      }
      break;
    case 5:
      if (cVar5 == '(') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,(int *)((long)&local_38 + 4));
        if (!bVar3) {
          return false;
        }
        this->arrayinputshapemapping_ = local_38._4_4_;
        goto LAB_00195fda;
      }
      break;
    case 6:
      if (cVar5 == '0') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,(int *)&local_38);
        if (!bVar3) {
          return false;
        }
        this->imageinputshapemapping_ = (int)local_38;
        goto LAB_00195fda;
      }
      break;
    case 10:
      if (cVar5 == 'R') {
        value_02 = mutable_updateparams(this);
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NetworkUpdateParameters>(input,value_02)
        ;
        goto LAB_0019603e;
      }
    }
switchD_0019605b_caseD_3:
    if (uVar4 == 0) {
      return true;
    }
    if ((uVar4 & 7) == 4) {
      return true;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_0019603e:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NeuralNetwork::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NeuralNetwork)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_preprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_arrayinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_imageinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkImageShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updateparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NeuralNetwork)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NeuralNetwork)
  return false;
#undef DO_
}